

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

kStatus __thiscall
gnilk::Log::Warning<char_const*,char_const*>(Log *this,char *arguments,char *arguments_1)

{
  int iVar1;
  char **in_RCX;
  kStatus kVar2;
  char *arguments_local_1;
  char *arguments_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  
  kVar2 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0x12d)) {
    arguments_local_1 = arguments_1;
    arguments_local = arguments;
    ::fmt::v10::sprintf<char_const*,char_const*,char>
              (&str,(v10 *)&arguments_local,&arguments_local_1,in_RCX);
    iVar1 = SendLogMessage(this,kWarning,&str);
    kVar2 = (uint)(iVar1 < 1) * 2;
    std::__cxx11::string::~string((string *)&str);
  }
  return kVar2;
}

Assistant:

inline kStatus Warning(T... arguments) const {
            if (!(isEnabled && WithinRange(kWarning))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kWarning, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }